

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O0

int MIR_op_eq_p(MIR_context_t ctx,MIR_op_t op1,MIR_op_t op2)

{
  undefined1 uVar1;
  undefined4 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined4 uVar5;
  undefined1 uVar6;
  int iVar7;
  char *__s1;
  char *__s2;
  bool local_3d;
  bool local_3c;
  bool local_3b;
  bool local_3a;
  bool local_39;
  MIR_context_t ctx_local;
  
  if ((op1._8_2_ & 0xff) == (op2._8_2_ & 0xff)) {
    uVar1 = op1.u.reg._0_1_;
    uVar3 = op1.u.mem.scale;
    uVar2 = op1.u.reg;
    uVar4 = op2.u.reg._0_1_;
    uVar6 = op2.u.mem.scale;
    uVar5 = op2.u.reg;
    switch(op1._8_1_) {
    case (BADTYPE)0x1:
      ctx_local._4_4_ = (uint)(uVar2 == uVar5);
      break;
    case (BADTYPE)0x2:
      ctx_local._4_4_ = (uint)(uVar2 == uVar5);
      break;
    case (BADTYPE)0x3:
      ctx_local._4_4_ = (uint)(op1.u.i == op2.u.i);
      break;
    case (BADTYPE)0x4:
      ctx_local._4_4_ = (uint)(op1.u.i == op2.u.i);
      break;
    case (BADTYPE)0x5:
      ctx_local._4_4_ = (uint)((float)uVar2 == (float)uVar5);
      break;
    case (BADTYPE)0x6:
      ctx_local._4_4_ = (uint)(op1.u.d == op2.u.d);
      break;
    case (BADTYPE)0x7:
      ctx_local._4_4_ = (uint)(op1.u.ld == op2.u.ld);
      break;
    case (BADTYPE)0x8:
      if (((op1.u.ref)->item_type == MIR_export_item) || ((op1.u.ref)->item_type == MIR_import_item)
         ) {
        __s1 = MIR_item_name(ctx,op1.u.ref);
        __s2 = MIR_item_name(ctx,op2.u.ref);
        iVar7 = strcmp(__s1,__s2);
        ctx_local._4_4_ = (uint)(iVar7 == 0);
      }
      else {
        ctx_local._4_4_ = (uint)(op1.u.i == op2.u.i);
      }
      break;
    case (BADTYPE)0x9:
      local_39 = false;
      if (op1.u.i == op2.u.i) {
        iVar7 = memcmp(op1.u.str.s,op2.u.str.s,op1.u.u);
        local_39 = iVar7 == 0;
      }
      ctx_local._4_4_ = (uint)local_39;
      break;
    case (BADTYPE)0xa:
      local_3a = false;
      if (((uVar1 == uVar4) && (local_3a = false, op1.u.mem.disp == op2.u.mem.disp)) &&
         ((local_3a = false, op1.u.mem.base == op2.u.mem.base &&
          (local_3a = false, op1.u.mem.index == op2.u.mem.index)))) {
        local_3b = op1.u.mem.index == 0 || uVar3 == uVar6;
        local_3a = local_3b;
      }
      ctx_local._4_4_ = (uint)local_3a;
      break;
    case (BADTYPE)0xb:
      local_3c = false;
      if ((((uVar1 == uVar4) && (local_3c = false, op1.u.mem.disp == op2.u.mem.disp)) &&
          (local_3c = false, op1.u.mem.base == op2.u.mem.base)) &&
         (local_3c = false, op1.u.mem.index == op2.u.mem.index)) {
        local_3d = op1.u.mem.index == 0xffffffff || uVar3 == uVar6;
        local_3c = local_3d;
      }
      ctx_local._4_4_ = (uint)local_3c;
      break;
    case (BADTYPE)0xc:
      ctx_local._4_4_ = (uint)(op1.u.i == op2.u.i);
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                    ,0xa28,"int MIR_op_eq_p(MIR_context_t, MIR_op_t, MIR_op_t)");
    }
  }
  else {
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

int MIR_op_eq_p (MIR_context_t ctx, MIR_op_t op1, MIR_op_t op2) {
  if (op1.mode != op2.mode) return FALSE;
  switch (op1.mode) {
  case MIR_OP_REG: return op1.u.reg == op2.u.reg;
  case MIR_OP_VAR: return op1.u.var == op2.u.var;
  case MIR_OP_INT: return op1.u.i == op2.u.i;
  case MIR_OP_UINT: return op1.u.u == op2.u.u;
  case MIR_OP_FLOAT: return op1.u.f == op2.u.f;
  case MIR_OP_DOUBLE: return op1.u.d == op2.u.d;
  case MIR_OP_LDOUBLE: return op1.u.ld == op2.u.ld;
  case MIR_OP_REF:
    if (op1.u.ref->item_type == MIR_export_item || op1.u.ref->item_type == MIR_import_item)
      return strcmp (MIR_item_name (ctx, op1.u.ref), MIR_item_name (ctx, op2.u.ref)) == 0;
    return op1.u.ref == op2.u.ref;
  case MIR_OP_STR:
    return op1.u.str.len == op2.u.str.len && memcmp (op1.u.str.s, op2.u.str.s, op1.u.str.len) == 0;
  case MIR_OP_MEM:
    return (op1.u.mem.type == op2.u.mem.type && op1.u.mem.disp == op2.u.mem.disp
            && op1.u.mem.base == op2.u.mem.base && op1.u.mem.index == op2.u.mem.index
            && (op1.u.mem.index == 0 || op1.u.mem.scale == op2.u.mem.scale));
  case MIR_OP_VAR_MEM:
    return (op1.u.var_mem.type == op2.u.var_mem.type && op1.u.var_mem.disp == op2.u.var_mem.disp
            && op1.u.var_mem.base == op2.u.var_mem.base
            && op1.u.var_mem.index == op2.u.var_mem.index
            && (op1.u.var_mem.index == MIR_NON_VAR || op1.u.var_mem.scale == op2.u.var_mem.scale));
  case MIR_OP_LABEL: return op1.u.label == op2.u.label;
  default: mir_assert (FALSE); /* we should not have other operands here */
  }
  return FALSE;
}